

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O1

void __thiscall SQCompiler::ShiftExp(SQCompiler *this)

{
  long lVar1;
  
  PlusExp(this);
  while (((lVar1 = this->_token, lVar1 == 0x132 || (lVar1 == 0x129)) || (lVar1 == 0x128))) {
    BIN_EXP<void(SQCompiler::*)()>(this,_OP_BITW,(offset_in_SQCompiler_to_subr)PlusExp,0);
  }
  return;
}

Assistant:

void ShiftExp()
    {
        PlusExp();
        for(;;) switch(_token) {
        case TK_USHIFTR: BIN_EXP(_OP_BITW, &SQCompiler::PlusExp,BW_USHIFTR); break;
        case TK_SHIFTL: BIN_EXP(_OP_BITW, &SQCompiler::PlusExp,BW_SHIFTL); break;
        case TK_SHIFTR: BIN_EXP(_OP_BITW, &SQCompiler::PlusExp,BW_SHIFTR); break;
        default: return;
        }
    }